

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O0

bool bssl::anon_unknown_18::VerifyHash(EVP_MD *type,Input hash,Input value)

{
  Input lhs;
  int iVar1;
  uint8_t *data;
  size_t count;
  Span<const_unsigned_char> local_a8;
  uchar *local_98;
  size_t local_90;
  uchar local_88 [8];
  uint8_t value_hash [64];
  uint local_3c;
  EVP_MD *pEStack_38;
  uint value_hash_len;
  EVP_MD *type_local;
  Input value_local;
  Input hash_local;
  
  value_local.data_.data_ = (uchar *)value.data_.size_;
  type_local = (EVP_MD *)value.data_.data_;
  value_local.data_.size_ = (size_t)hash.data_.data_;
  pEStack_38 = (EVP_MD *)type;
  data = bssl::der::Input::data((Input *)&type_local);
  count = bssl::der::Input::size((Input *)&type_local);
  iVar1 = EVP_Digest(data,count,local_88,&local_3c,pEStack_38,(ENGINE *)0x0);
  if (iVar1 == 0) {
    hash_local.data_.size_._7_1_ = false;
  }
  else {
    local_98 = (uchar *)value_local.data_.size_;
    local_90 = hash.data_.size_;
    bssl::der::Input::Input((Input *)&local_a8,local_88,(ulong)local_3c);
    lhs.data_.size_ = local_90;
    lhs.data_.data_ = local_98;
    hash_local.data_.size_._7_1_ = bssl::der::operator==(lhs,(Input)local_a8);
  }
  return hash_local.data_.size_._7_1_;
}

Assistant:

bool VerifyHash(const EVP_MD *type, der::Input hash, der::Input value) {
  unsigned value_hash_len;
  uint8_t value_hash[EVP_MAX_MD_SIZE];
  if (!EVP_Digest(value.data(), value.size(), value_hash, &value_hash_len, type,
                  nullptr)) {
    return false;
  }

  return hash == der::Input(value_hash, value_hash_len);
}